

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

void splashscreen_note(game_event_type type,game_event_data *data,void *user)

{
  wchar_t wVar1;
  int iVar2;
  bool bVar3;
  term *ptVar4;
  char *__s;
  size_t sVar5;
  
  if ((data->message).type == L'\x01') {
    prt(data->string,splashscreen_note::y,L'\0');
    pause_line(Term);
    wVar1 = splashscreen_note::y + L'\x01';
    bVar3 = splashscreen_note::y < L'\x17';
    splashscreen_note::y = L'\x02';
    if (bVar3) {
      splashscreen_note::y = wVar1;
    }
  }
  else {
    __s = format("[%s]",data->string);
    Term_erase(L'\0',(Term->hgt + -0x17) / 5 + L'\x17',L'ÿ');
    ptVar4 = Term;
    iVar2 = Term->wid;
    sVar5 = strlen(__s);
    Term_putstr((wchar_t)((long)iVar2 - sVar5 >> 1),(ptVar4->hgt + -0x17) / 5 + L'\x17',
                L'\xffffffff',L'\x01',__s);
  }
  Term_fresh();
  return;
}

Assistant:

static void splashscreen_note(game_event_type type, game_event_data *data,
							  void *user)
{
	if (data->message.type == MSG_BIRTH) {
		static int y = 2;

		/* Draw the message */
		prt(data->message.msg, y, 0);
		pause_line(Term);

		/* Advance one line (wrap if needed) */
		if (++y >= 24) y = 2;
	} else {
		char *s = format("[%s]", data->message.msg);
		Term_erase(0, (Term->hgt - 23) / 5 + 23, 255);
		Term_putstr((Term->wid - strlen(s)) / 2, (Term->hgt - 23) / 5 + 23, -1,
					COLOUR_WHITE, s);
	}

	Term_fresh();
}